

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileFunction(jx9_gen_state *pGen)

{
  sxu32 sVar1;
  SyToken *pName_00;
  sxi32 sVar2;
  bool bVar3;
  sxi32 rc;
  sxu32 nLine;
  sxi32 iFlags;
  SyString *pName;
  jx9_gen_state *pGen_local;
  
  sVar1 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0xc) != 0)) {
    pName_00 = pGen->pIn;
    sVar1 = pGen->pIn->nLine;
    pGen->pIn = pGen->pIn + 1;
    if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x200) != 0)) {
      pGen_local._4_4_ = GenStateCompileFunc(pGen,&pName_00->sData,0,(jx9_vm_func **)0x0);
    }
    else {
      sVar2 = jx9GenCompileError(pGen,1,sVar1,"Expected \'(\' after function name \'%z\'",pName_00);
      if (sVar2 == -10) {
        pGen_local._4_4_ = -10;
      }
      else {
        while( true ) {
          bVar3 = false;
          if (pGen->pIn < pGen->pEnd) {
            bVar3 = (pGen->pIn->nType & 0x40040) == 0;
          }
          if (!bVar3) break;
          pGen->pIn = pGen->pIn + 1;
        }
        pGen_local._4_4_ = 0;
      }
    }
  }
  else {
    sVar2 = jx9GenCompileError(pGen,1,sVar1,"Invalid function name");
    if (sVar2 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      while( true ) {
        bVar3 = false;
        if (pGen->pIn < pGen->pEnd) {
          bVar3 = (pGen->pIn->nType & 0x40040) == 0;
        }
        if (!bVar3) break;
        pGen->pIn = pGen->pIn + 1;
      }
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileFunction(jx9_gen_state *pGen)
{
	SyString *pName;
	sxi32 iFlags;
	sxu32 nLine;
	sxi32 rc;

	nLine = pGen->pIn->nLine;
	pGen->pIn++; /* Jump the 'function' keyword */
	iFlags = 0;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid function name */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Invalid function name");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or braces*/
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	pName = &pGen->pIn->sData;
	nLine = pGen->pIn->nLine;
	/* Jump the function name */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after function name '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Sychronize with the next semi-colon or '{' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile function body */
	rc = GenStateCompileFunc(&(*pGen),pName,iFlags,0);
	return rc;
}